

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManagement.h
# Opt level: O3

String * __thiscall chatra::Reference::allocateWithoutLock<chatra::String>(Reference *this)

{
  iterator *piVar1;
  pointer *pppOVar2;
  __atomic_flag_data_type _Var3;
  ReferenceNode *pRVar4;
  Storage *pSVar5;
  _Elt_pointer ppOVar6;
  String *pSVar7;
  iterator __position;
  String *this_00;
  _Elt_pointer puVar8;
  SpinLock *pSVar9;
  String *local_28;
  
  this_00 = (String *)operator_new(0xf8);
  String::String(this_00,this->node->group->storage);
  pRVar4 = this->node;
  pRVar4->type = Object;
  pRVar4->object = (Object *)this_00;
  if ((((pRVar4->group->storage->marking)._M_base._M_i & 1U) != 0) &&
     ((this_00->super_ObjectBase).super_Object.gcGeneration !=
      (pRVar4->group->storage->gcGeneration).super___atomic_base<unsigned_int>._M_i)) {
    pSVar9 = &pRVar4->group->storage->lockGcTargets;
    do {
      LOCK();
      _Var3 = (pSVar9->flag).super___atomic_flag_base._M_i;
      (pSVar9->flag).super___atomic_flag_base._M_i = true;
      UNLOCK();
    } while (_Var3 != false);
    pSVar5 = pRVar4->group->storage;
    ppOVar6 = (pSVar5->gcTargets).
              super__Deque_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (ppOVar6 ==
        (pSVar5->gcTargets).super__Deque_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      local_28 = this_00;
      std::deque<chatra::Object*,std::allocator<chatra::Object*>>::
      _M_push_back_aux<chatra::Object*const&>
                ((deque<chatra::Object*,std::allocator<chatra::Object*>> *)&pSVar5->gcTargets,
                 (Object **)&local_28);
    }
    else {
      *ppOVar6 = (Object *)this_00;
      piVar1 = &(pSVar5->gcTargets).
                super__Deque_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>._M_impl.
                super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    (pSVar9->flag).super___atomic_flag_base._M_i = false;
  }
  pSVar7 = (String *)this->node->object;
  pSVar5 = this->node->group->storage;
  do {
    LOCK();
    _Var3 = (pSVar5->lockObjects).flag.super___atomic_flag_base._M_i;
    (pSVar5->lockObjects).flag.super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var3 != false);
  puVar8 = (pSVar5->recycledObjectIndexes).
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  local_28 = pSVar7;
  if (puVar8 == (pSVar5->recycledObjectIndexes).
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    __position._M_current =
         (pSVar5->objects).super__Vector_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (pSVar7->super_ObjectBase).super_Object.objectIndex =
         (long)__position._M_current -
         (long)(pSVar5->objects).
               super__Vector_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>._M_impl.
               super__Vector_impl_data._M_start >> 3;
    if (__position._M_current ==
        (pSVar5->objects).super__Vector_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chatra::Object*,std::allocator<chatra::Object*>>::
      _M_realloc_insert<chatra::Object*const&>
                ((vector<chatra::Object*,std::allocator<chatra::Object*>> *)&pSVar5->objects,
                 __position,(Object **)&local_28);
    }
    else {
      *__position._M_current = (Object *)pSVar7;
      pppOVar2 = &(pSVar5->objects).
                  super__Vector_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppOVar2 = *pppOVar2 + 1;
    }
  }
  else {
    if (puVar8 == (pSVar5->recycledObjectIndexes).
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      puVar8 = (pSVar5->recycledObjectIndexes).
               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    (pSVar7->super_ObjectBase).super_Object.objectIndex = puVar8[-1];
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
              (&pSVar5->recycledObjectIndexes);
    (pSVar5->objects).super__Vector_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>.
    _M_impl.super__Vector_impl_data._M_start[(pSVar7->super_ObjectBase).super_Object.objectIndex] =
         (Object *)pSVar7;
  }
  (pSVar5->lockObjects).flag.super___atomic_flag_base._M_i = false;
  (local_28->super_ObjectBase).super_Object.gcGeneration =
       (pSVar5->gcGeneration).super___atomic_base<unsigned_int>._M_i;
  return this_00;
}

Assistant:

Type& Reference::allocateWithoutLock(Args&&... args) const {
	chatra_assert(node != nullptr);
	Type* object = new Type(node->group.storage, std::forward<Args>(args)...);
	node->setObject(object);
	node->group.storage.registerObject(node->object);
	return *object;
}